

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFObjectHandle.cc
# Opt level: O1

QPDF * __thiscall QPDFObjectHandle::getQPDF(QPDFObjectHandle *this,string *error_msg)

{
  element_type *peVar1;
  pointer pcVar2;
  QPDF *pQVar3;
  runtime_error *this_00;
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  peVar1 = (this->super_BaseHandle).obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  if (peVar1 == (element_type *)0x0) {
    pQVar3 = (QPDF *)0x0;
  }
  else {
    pQVar3 = peVar1->qpdf;
  }
  if (pQVar3 != (QPDF *)0x0) {
    return pQVar3;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  local_40[0] = local_30;
  if (error_msg->_M_string_length == 0) {
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_40,"attempt to use a null qpdf object","");
  }
  else {
    pcVar2 = (error_msg->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_40,pcVar2,pcVar2 + error_msg->_M_string_length);
  }
  std::runtime_error::runtime_error(this_00,(string *)local_40);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

QPDF&
QPDFObjectHandle::getQPDF(std::string const& error_msg) const
{
    if (auto result = obj ? obj->getQPDF() : nullptr) {
        return *result;
    }
    throw std::runtime_error(error_msg.empty() ? "attempt to use a null qpdf object" : error_msg);
}